

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::reduceTri
               (void *src,int sstride,int w,int param_4,void *dst,int dstride,DataType dt,int nchan)

{
  uint16_t uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  void *local_98;
  long local_90;
  
  local_98 = dst;
  switch(dt) {
  case dt_uint8:
    iVar15 = nchan * w;
    lVar9 = (long)nchan;
    lVar8 = (long)src + (((long)iVar15 + (long)((w + -1) * sstride)) - lVar9);
    iVar10 = sstride * 2;
    pvVar2 = (void *)((long)(w * sstride) + (long)src);
    lVar16 = (long)sstride + (long)src;
    lVar11 = (long)src + lVar9;
    while (src != pvVar2) {
      pvVar6 = (void *)((long)src + (long)iVar15);
      lVar4 = lVar16;
      lVar13 = lVar11;
      while (src != pvVar6) {
        for (lVar3 = 0; lVar9 != lVar3; lVar3 = lVar3 + 1) {
          *(char *)((long)local_98 + lVar3) =
               (char)((uint)*(byte *)(lVar8 + lVar3) + (uint)*(byte *)(lVar4 + lVar3) +
                      (uint)*(byte *)(lVar13 + lVar3) + (uint)*(byte *)((long)src + lVar3) >> 2);
        }
        lVar8 = lVar8 + -(nchan + sstride * 2) + lVar3;
        local_98 = (void *)((long)local_98 + lVar3);
        lVar4 = lVar4 + lVar9 * 2;
        lVar13 = lVar13 + lVar9 * 2;
        src = (void *)((long)src + lVar9 * 2);
      }
      lVar8 = lVar8 + (w * sstride + nchan * -2);
      local_98 = (void *)((long)local_98 + (long)(iVar15 / -2 + dstride));
      lVar16 = lVar16 + iVar10;
      lVar11 = lVar11 + iVar10;
      src = (void *)((long)pvVar6 + (long)(iVar10 - iVar15));
    }
    break;
  case dt_uint16:
    iVar15 = sstride / 2;
    iVar10 = nchan * w;
    lVar9 = (long)nchan;
    lVar11 = (long)src + lVar9 * -2 + (long)iVar10 * 2 + (long)((w + -1) * iVar15) * 2;
    pvVar2 = (void *)((long)src + (long)(w * iVar15) * 2);
    pvVar6 = (void *)((long)src + (long)iVar15 * 2);
    lVar8 = (long)(iVar15 * 2) * 2;
    pvVar12 = (void *)((long)src + lVar9 * 2);
    lVar16 = lVar9 * 4;
    for (; src != pvVar2; src = (void *)((long)src + lVar8)) {
      pvVar5 = pvVar12;
      pvVar7 = pvVar6;
      for (pvVar14 = src; pvVar14 != (void *)((long)src + (long)iVar10 * 2);
          pvVar14 = (void *)((long)pvVar14 + lVar16)) {
        for (lVar4 = 0; lVar9 * 2 != lVar4; lVar4 = lVar4 + 2) {
          *(short *)((long)local_98 + lVar4) =
               (short)((uint)*(ushort *)(lVar11 + lVar4) + (uint)*(ushort *)((long)pvVar7 + lVar4) +
                       (uint)*(ushort *)((long)pvVar5 + lVar4) +
                       (uint)*(ushort *)((long)pvVar14 + lVar4) >> 2);
        }
        lVar11 = lVar11 + lVar4 + (long)(iVar15 * -2) * 2 + lVar9 * -2;
        local_98 = (void *)((long)local_98 + lVar4);
        pvVar7 = (void *)((long)pvVar7 + lVar16);
        pvVar5 = (void *)((long)pvVar5 + lVar16);
      }
      lVar11 = lVar11 + (long)(w * iVar15 + nchan * -2) * 2;
      local_98 = (void *)((long)local_98 + (long)(iVar10 / -2 + dstride / 2) * 2);
      pvVar6 = (void *)((long)pvVar6 + lVar8);
      pvVar12 = (void *)((long)pvVar12 + lVar8);
    }
    break;
  case dt_half:
    iVar15 = sstride / 2;
    iVar10 = nchan * w;
    lVar8 = (long)nchan;
    local_90 = (long)src + lVar8 * -2 + (long)iVar10 * 2 + (long)((w + -1) * iVar15) * 2;
    pvVar2 = (void *)((long)src + (long)(w * iVar15) * 2);
    pvVar6 = (void *)((long)src + (long)iVar15 * 2);
    lVar11 = (long)(iVar15 * 2) * 2;
    pvVar12 = (void *)((long)src + lVar8 * 2);
    lVar9 = lVar8 * 4;
    for (; src != pvVar2; src = (void *)((long)src + lVar11)) {
      pvVar5 = pvVar6;
      pvVar7 = pvVar12;
      for (pvVar14 = src; pvVar14 != (void *)((long)src + (long)iVar10 * 2);
          pvVar14 = (void *)((long)pvVar14 + lVar9)) {
        for (lVar16 = 0; lVar8 * 2 != lVar16; lVar16 = lVar16 + 2) {
          uVar1 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar14 + lVar16) * 4) +
                                       *(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar7 + lVar16) * 4) +
                                       *(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar5 + lVar16) * 4) +
                                      *(float *)(PtexHalf::h2fTable +
                                                (ulong)*(ushort *)(local_90 + lVar16) * 4)) * 0.25);
          *(uint16_t *)((long)local_98 + lVar16) = uVar1;
        }
        local_90 = local_90 + lVar16 + (long)(iVar15 * -2) * 2 + lVar8 * -2;
        local_98 = (void *)((long)local_98 + lVar16);
        pvVar5 = (void *)((long)pvVar5 + lVar9);
        pvVar7 = (void *)((long)pvVar7 + lVar9);
      }
      local_90 = local_90 + (long)(w * iVar15 + nchan * -2) * 2;
      local_98 = (void *)((long)local_98 + (long)(iVar10 / -2 + dstride / 2) * 2);
      pvVar6 = (void *)((long)pvVar6 + lVar11);
      pvVar12 = (void *)((long)pvVar12 + lVar11);
    }
    break;
  case dt_float:
    iVar15 = sstride / 4;
    lVar8 = (long)nchan;
    iVar10 = nchan * w;
    lVar11 = (long)src + lVar8 * -4 + (long)iVar10 * 4 + (long)((w + -1) * iVar15) * 4;
    pvVar2 = (void *)((long)src + (long)(w * iVar15) * 4);
    pvVar6 = (void *)((long)src + (long)iVar15 * 4);
    lVar16 = (long)(iVar15 * 2) * 4;
    pvVar12 = (void *)((long)src + lVar8 * 4);
    lVar9 = lVar8 * 8;
    for (; src != pvVar2; src = (void *)((long)src + lVar16)) {
      pvVar5 = pvVar12;
      pvVar7 = pvVar6;
      for (pvVar14 = src; pvVar14 != (void *)((long)src + (long)iVar10 * 4);
          pvVar14 = (void *)((long)pvVar14 + lVar9)) {
        for (lVar4 = 0; lVar8 * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
          *(float *)((long)local_98 + lVar4) =
               (*(float *)((long)pvVar14 + lVar4) + *(float *)((long)pvVar5 + lVar4) +
                *(float *)((long)pvVar7 + lVar4) + *(float *)(lVar11 + lVar4)) * 0.25;
        }
        lVar11 = lVar11 + lVar4 + (long)(iVar15 * -2) * 4 + lVar8 * -4;
        local_98 = (void *)((long)local_98 + lVar4);
        pvVar7 = (void *)((long)pvVar7 + lVar9);
        pvVar5 = (void *)((long)pvVar5 + lVar9);
      }
      lVar11 = lVar11 + (long)(w * iVar15 + nchan * -2) * 4;
      local_98 = (void *)((long)local_98 + (long)(iVar10 / -2 + dstride / 4) * 4);
      pvVar6 = (void *)((long)pvVar6 + lVar16);
      pvVar12 = (void *)((long)pvVar12 + lVar16);
    }
  }
  return;
}

Assistant:

void reduceTri(const void* src, int sstride, int w, int /*vw*/,
               void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceTri(static_cast<const uint8_t*>(src), sstride, w, 0,
                                 static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceTri(static_cast<const PtexHalf*>(src), sstride, w, 0,
                                 static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceTri(static_cast<const uint16_t*>(src), sstride, w, 0,
                                 static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceTri(static_cast<const float*>(src), sstride, w, 0,
                                 static_cast<float*>(dst), dstride, nchan); break;
    }
}